

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

GameCommand * __thiscall
RenX::Server::triggerCommand
          (Server *this,string_view trigger,PlayerInfo *player,string_view parameters)

{
  int iVar1;
  pointer puVar2;
  GameCommand *pGVar3;
  pointer ppPVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  Core *this_00;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *pvVar8;
  pointer puVar9;
  Plugin **plugin;
  pointer ppPVar10;
  string_view message;
  GameCommand *local_88;
  undefined4 local_40;
  undefined4 uStack_38;
  
  puVar2 = (this->m_commands).
           super__Vector_base<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  GameCommand::active_server = this;
  for (puVar9 = (this->m_commands).
                super__Vector_base<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; bVar5 = puVar9 == puVar2, !bVar5;
      puVar9 = puVar9 + 1) {
    cVar6 = Jupiter::Command::matches
                      ((puVar9->_M_t).
                       super___uniq_ptr_impl<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_RenX::GameCommand_*,_std::default_delete<RenX::GameCommand>_>
                       .super__Head_base<0UL,_RenX::GameCommand_*,_false>._M_head_impl,
                       trigger._M_len,trigger._M_str);
    if (cVar6 != '\0') {
      iVar1 = player->access;
      iVar7 = GameCommand::getAccessLevel
                        ((puVar9->_M_t).
                         super___uniq_ptr_impl<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_RenX::GameCommand_*,_std::default_delete<RenX::GameCommand>_>
                         .super__Head_base<0UL,_RenX::GameCommand_*,_false>._M_head_impl);
      if (iVar1 < iVar7) {
        message._M_str = "Access Denied.";
        message._M_len = 0xe;
        sendMessage(this,player,message);
      }
      else {
        pGVar3 = (puVar9->_M_t).
                 super___uniq_ptr_impl<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_RenX::GameCommand_*,_std::default_delete<RenX::GameCommand>_>
                 .super__Head_base<0UL,_RenX::GameCommand_*,_false>._M_head_impl;
        (**(code **)((long)(pGVar3->super_Command)._vptr_Command + 0x18))
                  (pGVar3,this,player,parameters._M_len,parameters._M_str);
      }
      this_00 = getCore();
      pvVar8 = Core::getPlugins(this_00);
      ppPVar4 = (pvVar8->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppPVar10 = (pvVar8->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>).
                      _M_impl.super__Vector_impl_data._M_start; ppPVar10 != ppPVar4;
          ppPVar10 = ppPVar10 + 1) {
        local_40 = (undefined4)parameters._M_len;
        uStack_38 = parameters._M_str._0_4_;
        (**(code **)(*(long *)*ppPVar10 + 0x138))
                  (*ppPVar10,this,trigger._M_len,trigger._M_str,player,
                   (puVar9->_M_t).
                   super___uniq_ptr_impl<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_RenX::GameCommand_*,_std::default_delete<RenX::GameCommand>_>
                   .super__Head_base<0UL,_RenX::GameCommand_*,_false>._M_head_impl,local_40,
                   uStack_38);
      }
      local_88 = (puVar9->_M_t).
                 super___uniq_ptr_impl<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_RenX::GameCommand_*,_std::default_delete<RenX::GameCommand>_>
                 .super__Head_base<0UL,_RenX::GameCommand_*,_false>._M_head_impl;
    }
    if (cVar6 != '\0') break;
  }
  if (bVar5) {
    GameCommand::active_server = GameCommand::selected_server;
    local_88 = (GameCommand *)0x0;
  }
  return local_88;
}

Assistant:

RenX::GameCommand *RenX::Server::triggerCommand(std::string_view trigger, RenX::PlayerInfo &player, std::string_view parameters) {
	RenX::GameCommand::active_server = this;
	for (const auto& command : m_commands) {
		if (command->matches(trigger)) {
			if (player.access >= command->getAccessLevel()) {
				command->trigger(this, &player, parameters);
			}
			else {
				sendMessage(player, "Access Denied."sv);
			}

			// TODO: avoiding modifying behavior for now, but this probably doesn't need to be called on access denied
			for (const auto& plugin : getCore()->getPlugins()) {
				plugin->RenX_OnCommandTriggered(*this, trigger, player, parameters, *command);
			}

			return command.get();
		}
	}

	// TODO: do we need to set active_server on the return above as well?
	RenX::GameCommand::active_server = RenX::GameCommand::selected_server;
	return nullptr;
}